

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O1

void nghttp3_qpack_encoder_unblock(nghttp3_qpack_encoder *encoder,uint64_t max_cnt)

{
  anon_union_32_2_22804d16_for_nghttp3_ksl_blk_0 *paVar1;
  nghttp3_blocked_streams_key bsk;
  nghttp3_ksl_it local_40;
  nghttp3_ksl_blk *local_28;
  undefined8 uStack_20;
  
  uStack_20 = 0;
  local_28 = (nghttp3_ksl_blk *)max_cnt;
  nghttp3_ksl_lower_bound(&local_40,&encoder->blocked_streams,&local_28);
  while( true ) {
    if ((local_40.i == ((local_40.blk)->field_0).field_0.n) &&
       (((local_40.blk)->field_0).field_0.next == (nghttp3_ksl_blk *)0x0)) break;
    paVar1 = (anon_union_32_2_22804d16_for_nghttp3_ksl_blk_0 *)
             ((long)&local_40.blk[1].field_0 + local_40.i * (local_40.ksl)->nodelen);
    local_28 = (paVar1->field_0).next;
    uStack_20 = *(undefined8 *)((long)paVar1 + 8);
    nghttp3_ksl_remove_hint(&encoder->blocked_streams,&local_40,&local_40,&local_28);
  }
  return;
}

Assistant:

void nghttp3_qpack_encoder_unblock(nghttp3_qpack_encoder *encoder,
                                   uint64_t max_cnt) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = max_cnt,
  };
  nghttp3_ksl_it it;

  it = nghttp3_ksl_lower_bound(&encoder->blocked_streams, &bsk);

  for (; !nghttp3_ksl_it_end(&it);) {
    bsk = *(nghttp3_blocked_streams_key *)nghttp3_ksl_it_key(&it);
    nghttp3_ksl_remove_hint(&encoder->blocked_streams, &it, &it, &bsk);
  }
}